

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScObjArrayNoArg(Lowerer *this,Instr *newObjInstr)

{
  ProfileId index;
  OpCode opcode;
  Func *func;
  Lowerer *this_00;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  ProfiledInstr *pPVar5;
  JITTimeProfileInfo *pJVar6;
  intptr_t weakFuncRef;
  Opnd *pOVar7;
  Opnd *src1Opnd;
  ProfiledInstr *instr;
  LabelInstr *pLVar8;
  AddrOpnd *pAVar9;
  HelperCallOpnd *newSrc;
  Instr *pIVar10;
  intptr_t arrayInfoAddr;
  Lowerer *pLVar11;
  ArrayCallSiteInfo *arrayInfo;
  Instr *local_40;
  
  func = newObjInstr->m_func;
  this_00 = (Lowerer *)newObjInstr->m_src1;
  pLVar11 = this_00;
  bVar2 = IR::Opnd::IsAddrOpnd((Opnd *)this_00);
  if (bVar2) {
    local_40 = InsertLoweredRegionStartMarker(pLVar11,newObjInstr);
    instr = (ProfiledInstr *)newObjInstr;
  }
  else {
    if (((newObjInstr->field_0x38 & 0x10) == 0) ||
       (pLVar11 = (Lowerer *)newObjInstr, bVar2 = IR::Instr::OnlyHasLazyBailOut(newObjInstr), bVar2)
       ) {
      pIVar10 = LowerNewScObject(this,newObjInstr,true,false,false);
      return pIVar10;
    }
    local_40 = InsertLoweredRegionStartMarker(pLVar11,newObjInstr);
    BVar3 = IR::Instr::GetBailOutKind(newObjInstr);
    if ((BVar3 != BailOutOnNotNativeArray) &&
       (BVar3 = IR::Instr::GetBailOutKind(newObjInstr),
       BVar3 != (LazyBailOut|BailOutOnNotNativeArray))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1511,
                         "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                         ,
                         "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                        );
      if (!bVar2) goto LAB_0056674d;
      *puVar4 = 0;
    }
    pLVar8 = IR::LabelInstr::New(Label,func,false);
    pLVar11 = this;
    pOVar7 = LoadLibraryValueOpnd(this,newObjInstr,ValueArrayConstructor);
    InsertCompareBranch(pLVar11,(Opnd *)this_00,pOVar7,BrEq_A,true,pLVar8,newObjInstr,false);
    opcode = newObjInstr->m_opcode;
    pOVar7 = IR::Instr::UnlinkDst(newObjInstr);
    src1Opnd = IR::Instr::UnlinkSrc1(newObjInstr);
    instr = IR::ProfiledInstr::New(opcode,pOVar7,src1Opnd,func);
    pPVar5 = IR::Instr::AsProfiledInstr(newObjInstr);
    (instr->u).profileId = (pPVar5->u).profileId;
    IR::Instr::InsertAfter(newObjInstr,&instr->super_Instr);
    newObjInstr->m_opcode = BailOut;
    GenerateBailOut(this,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(&instr->super_Instr,&pLVar8->super_Instr);
  }
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x152c,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()");
    if (!bVar2) goto LAB_0056674d;
    *puVar4 = 0;
  }
  pPVar5 = IR::Instr::AsProfiledInstr(&instr->super_Instr);
  index = (pPVar5->u).field_3.fldInfoData.f1;
  weakFuncRef = 0;
  arrayInfoAddr = 0;
  arrayInfo = (ArrayCallSiteInfo *)0x0;
  if (index != 0xffff) {
    pJVar6 = Func::GetReadOnlyProfileInfo(func);
    arrayInfo = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar6,index);
    pJVar6 = Func::GetReadOnlyProfileInfo(func);
    arrayInfoAddr = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar6,index);
    if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1536,"(arrayInfo)","arrayInfo");
      if (!bVar2) goto LAB_0056674d;
      *puVar4 = 0;
    }
    weakFuncRef = Func::GetWeakFuncRef(func);
    if (weakFuncRef == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1538,"(weakFuncRef)","weakFuncRef");
      if (!bVar2) {
LAB_0056674d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      weakFuncRef = 0;
    }
  }
  pLVar8 = IR::LabelInstr::New(Label,func,false);
  GenerateProfiledNewScObjArrayFastPath
            (this,&instr->super_Instr,arrayInfo,arrayInfoAddr,weakFuncRef,0,pLVar8,true);
  IR::Instr::InsertAfter(&instr->super_Instr,&pLVar8->super_Instr);
  pLVar11 = (Lowerer *)&this->m_lowererMD;
  pAVar9 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,func,false,(Var)0x0)
  ;
  LowererMD::LoadHelperArgument((LowererMD *)pLVar11,&instr->super_Instr,&pAVar9->super_Opnd);
  pAVar9 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicArrayCallSiteInfo,func,false,(Var)0x0)
  ;
  LowererMD::LoadHelperArgument((LowererMD *)pLVar11,&instr->super_Instr,&pAVar9->super_Opnd);
  LoadScriptContext(this,&instr->super_Instr);
  LowererMD::LoadHelperArgument((LowererMD *)pLVar11,&instr->super_Instr,(Opnd *)this_00);
  IR::Instr::UnlinkSrc1(&instr->super_Instr);
  newSrc = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstanceNoArg,func);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall((LowererMD *)pLVar11,&instr->super_Instr,0);
  pIVar10 = RemoveLoweredRegionStartMarker(pLVar11,local_40);
  return pIVar10;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArrayNoArg(IR::Instr *newObjInstr)
{
    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    IR::Instr* startMarkerInstr = nullptr;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, false);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    Assert(newObjInstr->IsProfiledInstr());

    intptr_t weakFuncRef = 0;
    intptr_t arrayInfoAddr = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, 0, labelDone, true);
    newObjInstr->InsertAfter(labelDone);

    m_lowererMD.LoadHelperArgument(newObjInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func));
    m_lowererMD.LoadHelperArgument(newObjInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func));

    LoadScriptContext(newObjInstr);

    m_lowererMD.LoadHelperArgument(newObjInstr, targetOpnd);
    newObjInstr->UnlinkSrc1();
    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperScrArr_ProfiledNewInstanceNoArg, func));
    m_lowererMD.LowerCall(newObjInstr, 0);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}